

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_SetJoin.cpp
# Opt level: O3

void __thiscall
SetJoinGameCommand::trigger
          (SetJoinGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  size_type sVar1;
  pointer pcVar2;
  Config *pCVar3;
  size_t sVar4;
  char *pcVar5;
  long *local_78 [2];
  long local_68 [2];
  Server *local_58;
  string local_50;
  
  pCVar3 = pluginInstance.setjoin_file;
  pcVar5 = parameters._M_str;
  sVar4 = parameters._M_len;
  sVar1 = (player->uuid)._M_string_length;
  if (sVar1 == 0) {
    RenX::Server::sendMessage(source,player,0x28,"Error: A setjoin message requires steam.");
    return;
  }
  if (sVar4 != 0) {
    pcVar2 = (player->uuid)._M_dataplus._M_p;
    local_78[0] = local_68;
    local_58 = source;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar5,pcVar5 + sVar4);
    Jupiter::Config::set(pCVar3,sVar1,pcVar2,local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    Jupiter::Config::write();
    string_printf_abi_cxx11_
              (&local_50,"%.*s, your join message is now: %.*s",(player->name)._M_string_length,
               (player->name)._M_dataplus._M_p,sVar4,pcVar5);
    RenX::Server::sendMessage(local_58,player,local_50._M_string_length,local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  DelJoinGameCommand::trigger((DelJoinGameCommand *)this,source,player,parameters);
  return;
}

Assistant:

void SetJoinGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (!player->uuid.empty()) {
		if (!parameters.empty()) {
			pluginInstance.setjoin_file.set(player->uuid, static_cast<std::string>(parameters));
			pluginInstance.setjoin_file.write();
			source->sendMessage(*player, string_printf("%.*s, your join message is now: %.*s", player->name.size(), player->name.data(), parameters.size(),
				parameters.data()));
		}
		else DelJoinGameCommand_instance.trigger(source, player, parameters);
	}
	else source->sendMessage(*player, "Error: A setjoin message requires steam."sv);
}